

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

void __thiscall
Tokenizer::registerReplacement
          (Tokenizer *this,Identifier *identifier,vector<Token,_std::allocator<Token>_> *tokens)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Replacement replacement;
  value_type local_58;
  
  paVar1 = &local_58.identifier._name.field_2;
  pcVar2 = (identifier->_name)._M_dataplus._M_p;
  local_58.identifier._name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (identifier->_name)._M_string_length);
  std::vector<Token,_std::allocator<Token>_>::vector(&local_58.value,tokens);
  std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::push_back
            (&this->replacements,&local_58);
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_58.value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.identifier._name._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.identifier._name._M_dataplus._M_p,
                    local_58.identifier._name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Tokenizer::registerReplacement(const Identifier& identifier, std::vector<Token>& tokens)
{
	Replacement replacement { identifier, tokens };
	replacements.push_back(replacement);
}